

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-util.c
# Opt level: O2

void move_mimicked_object(chunk *c,monster_conflict *mon,loc src,loc dest)

{
  object *src_00;
  _Bool _Var1;
  object *dest_00;
  object *poVar2;
  loc lVar3;
  chunk *c_00;
  _Bool dummy;
  monster_conflict *local_40;
  object *moved;
  
  src_00 = mon->mimicked_obj;
  dest_00 = object_new();
  dummy = true;
  moved = dest_00;
  if (src_00 != (object *)0x0) {
    object_copy(dest_00,src_00);
    dest_00->oidx = 0;
    src_00->mimicking_m_idx = 0;
    if (src_00->known != (object *)0x0) {
      poVar2 = object_new();
      dest_00->known = poVar2;
      object_copy(poVar2,src_00->known);
      poVar2 = dest_00->known;
      poVar2->oidx = 0;
      local_40 = mon;
      lVar3 = (loc)loc(0,0);
      poVar2->grid = lVar3;
      mon = local_40;
    }
    _Var1 = floor_carry(c,dest,dest_00,&dummy);
    if (_Var1) {
      mon->mimicked_obj = dest_00;
    }
    else {
      dest_00->mimicking_m_idx = 0;
      mon->mimicked_obj = (object *)0x0;
      _Var1 = flag_has_dbg(mon->race->flags,0xc,0x1e,"mon->race->flags","RF_MIMIC_INV");
      if (_Var1) {
        monster_carry(c,mon,dest_00);
      }
      else {
        if ((chunk *)cave == c) {
          c_00 = (chunk *)player->cave;
        }
        else {
          c_00 = (chunk *)0x0;
        }
        if (dest_00->known != (object *)0x0) {
          object_delete(c_00,(chunk *)0x0,&dest_00->known);
        }
        object_delete(c,c_00,&moved);
      }
    }
    square_delete_object((chunk_conflict *)c,src,src_00,true,false);
    return;
  }
  __assert_fail("mimicked",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-util.c"
                ,0x23d,
                "void move_mimicked_object(struct chunk *, struct monster *, struct loc, struct loc)"
               );
}

Assistant:

static void move_mimicked_object(struct chunk *c, struct monster *mon,
	struct loc src, struct loc dest)
{
	struct object *mimicked = mon->mimicked_obj;
	/*
	 * Move a copy so, if necessary, the original can remain as a
	 * placeholder for the known version of the object in the player's
	 * view of the cave.
	 */
	struct object *moved = object_new();
	bool dummy = true;

	assert(mimicked);
	object_copy(moved, mimicked);
	moved->oidx = 0;
	mimicked->mimicking_m_idx = 0;
	if (mimicked->known) {
		moved->known = object_new();
		object_copy(moved->known, mimicked->known);
		moved->known->oidx = 0;
		moved->known->grid = loc(0,0);
	}
	if (floor_carry(c, dest, moved, &dummy)) {
		mon->mimicked_obj = moved;
	} else {
		/* Could not move the object so cancel mimicry. */
		moved->mimicking_m_idx = 0;
		mon->mimicked_obj = NULL;
		/* Give object to monster if appropriate; otherwise, delete. */
		if (!rf_has(mon->race->flags, RF_MIMIC_INV) ||
			!monster_carry(c, mon, moved)) {
			struct chunk *p_c = (c == cave) ? player->cave : NULL;
			if (moved->known) {
				object_delete(p_c, NULL, &moved->known);
			}
			object_delete(c, p_c, &moved);
		}
	}
	square_delete_object(c, src, mimicked, true, false);
}